

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_5::DecFmtSymDataSink::resolveMissingMonetarySeparators
          (DecFmtSymDataSink *this,UnicodeString *fSymbols)

{
  UnicodeString *fSymbols_local;
  DecFmtSymDataSink *this_local;
  
  if (this->seenSymbol[10] == '\0') {
    DecimalFormatSymbols::setSymbol(this->dfs,kMonetarySeparatorSymbol,fSymbols,'\x01');
  }
  if (this->seenSymbol[0x11] == '\0') {
    DecimalFormatSymbols::setSymbol(this->dfs,kMonetaryGroupingSeparatorSymbol,fSymbols + 1,'\x01');
  }
  return;
}

Assistant:

void resolveMissingMonetarySeparators(const UnicodeString* fSymbols) {
        if (!seenSymbol[DecimalFormatSymbols::kMonetarySeparatorSymbol]) {
            dfs.setSymbol(
                DecimalFormatSymbols::kMonetarySeparatorSymbol,
                fSymbols[DecimalFormatSymbols::kDecimalSeparatorSymbol]);
        }
        if (!seenSymbol[DecimalFormatSymbols::kMonetaryGroupingSeparatorSymbol]) {
            dfs.setSymbol(
                DecimalFormatSymbols::kMonetaryGroupingSeparatorSymbol,
                fSymbols[DecimalFormatSymbols::kGroupingSeparatorSymbol]);
        }
    }